

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage.cpp
# Opt level: O2

void test_pos<wchar_t>(string *source,
                      basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                      *target,string *encoding)

{
  int iVar1;
  char *pcVar2;
  wchar_t *pwVar3;
  bool bVar4;
  __type _Var5;
  ostream *poVar6;
  runtime_error *prVar7;
  allocator local_59;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  locale l;
  generator g;
  
  booster::locale::generator::generator(&g);
  bVar4 = std::operator==(encoding,"ISO8859-8");
  if (bVar4) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
                   "he_IL.",encoding);
    booster::locale::generator::generate((string *)&l);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
                   "en_US.",encoding);
    booster::locale::generator::generate((string *)&l);
  }
  std::__cxx11::string::~string((string *)&local_58);
  test_counter = test_counter + 1;
  booster::locale::conv::to_utf<wchar_t>(&local_58,source,encoding,default_method);
  _Var5 = std::operator==(&local_58,target);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  if (!_Var5) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xb5);
    poVar6 = std::operator<<(poVar6," to_utf<Char>(source,encoding)==target");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_58,"Error limits reached, stopping unit test",&local_59);
      booster::runtime_error::runtime_error(prVar7,(string *)&local_58);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::to_utf<wchar_t>
            (&local_58,(source->_M_dataplus)._M_p,encoding,default_method);
  _Var5 = std::operator==(&local_58,target);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  if (!_Var5) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xb6);
    poVar6 = std::operator<<(poVar6," to_utf<Char>(source.c_str(),encoding)==target");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_58,"Error limits reached, stopping unit test",&local_59);
      booster::runtime_error::runtime_error(prVar7,(string *)&local_58);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar2 = (source->_M_dataplus)._M_p;
  booster::locale::conv::to_utf<wchar_t>
            ((char *)&local_58,pcVar2,(string *)(pcVar2 + source->_M_string_length),
             (method_type)encoding);
  _Var5 = std::operator==(&local_58,target);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  if (!_Var5) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xb7);
    poVar6 = std::operator<<(poVar6,
                             " to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_58,"Error limits reached, stopping unit test",&local_59);
      booster::runtime_error::runtime_error(prVar7,(string *)&local_58);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::to_utf<wchar_t>(&local_58,source,&l,default_method);
  _Var5 = std::operator==(&local_58,target);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  if (!_Var5) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xb9);
    poVar6 = std::operator<<(poVar6," to_utf<Char>(source,l)==target");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_58,"Error limits reached, stopping unit test",&local_59);
      booster::runtime_error::runtime_error(prVar7,(string *)&local_58);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::to_utf<wchar_t>(&local_58,(source->_M_dataplus)._M_p,&l,default_method);
  _Var5 = std::operator==(&local_58,target);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  if (!_Var5) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xba);
    poVar6 = std::operator<<(poVar6," to_utf<Char>(source.c_str(),l)==target");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_58,"Error limits reached, stopping unit test",&local_59);
      booster::runtime_error::runtime_error(prVar7,(string *)&local_58);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar2 = (source->_M_dataplus)._M_p;
  booster::locale::conv::to_utf<wchar_t>
            (&local_58,pcVar2,pcVar2 + source->_M_string_length,&l,default_method);
  _Var5 = std::operator==(&local_58,target);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  if (!_Var5) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xbb);
    poVar6 = std::operator<<(poVar6,
                             " to_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target")
    ;
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_58,"Error limits reached, stopping unit test",&local_59);
      booster::runtime_error::runtime_error(prVar7,(string *)&local_58);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::from_utf<wchar_t>((string *)&local_58,target,encoding,default_method);
  _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_58,source);
  std::__cxx11::string::~string((string *)&local_58);
  if (!_Var5) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xbd);
    poVar6 = std::operator<<(poVar6," from_utf<Char>(target,encoding)==source");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_58,"Error limits reached, stopping unit test",&local_59);
      booster::runtime_error::runtime_error(prVar7,(string *)&local_58);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::from_utf<wchar_t>
            ((string *)&local_58,(target->_M_dataplus)._M_p,encoding,default_method);
  _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_58,source);
  std::__cxx11::string::~string((string *)&local_58);
  if (!_Var5) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xbe);
    poVar6 = std::operator<<(poVar6," from_utf<Char>(target.c_str(),encoding)==source");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_58,"Error limits reached, stopping unit test",&local_59);
      booster::runtime_error::runtime_error(prVar7,(string *)&local_58);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar3 = (target->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)&local_58,pwVar3,(string *)(pwVar3 + target->_M_string_length),
             (method_type)encoding);
  _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_58,source);
  std::__cxx11::string::~string((string *)&local_58);
  if (!_Var5) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xbf);
    poVar6 = std::operator<<(poVar6,
                             " from_utf<Char>(target.c_str(),target.c_str()+target.size(),encoding)==source"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_58,"Error limits reached, stopping unit test",&local_59);
      booster::runtime_error::runtime_error(prVar7,(string *)&local_58);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::from_utf<wchar_t>((string *)&local_58,target,&l,default_method);
  _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_58,source);
  std::__cxx11::string::~string((string *)&local_58);
  if (!_Var5) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xc1);
    poVar6 = std::operator<<(poVar6," from_utf<Char>(target,l)==source");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_58,"Error limits reached, stopping unit test",&local_59);
      booster::runtime_error::runtime_error(prVar7,(string *)&local_58);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::from_utf<wchar_t>
            ((string *)&local_58,(target->_M_dataplus)._M_p,&l,default_method);
  _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_58,source);
  std::__cxx11::string::~string((string *)&local_58);
  if (!_Var5) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xc2);
    poVar6 = std::operator<<(poVar6," from_utf<Char>(target.c_str(),l)==source");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_58,"Error limits reached, stopping unit test",&local_59);
      booster::runtime_error::runtime_error(prVar7,(string *)&local_58);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar3 = (target->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<wchar_t>
            ((string *)&local_58,pwVar3,pwVar3 + target->_M_string_length,&l,default_method);
  _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_58,source);
  std::__cxx11::string::~string((string *)&local_58);
  if (!_Var5) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xc3);
    poVar6 = std::operator<<(poVar6,
                             " from_utf<Char>(target.c_str(),target.c_str()+target.size(),l)==source"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_58,"Error limits reached, stopping unit test",&local_59);
      booster::runtime_error::runtime_error(prVar7,(string *)&local_58);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::~locale(&l);
  booster::locale::generator::~generator(&g);
  return;
}

Assistant:

void test_pos(std::string source,std::basic_string<Char> target,std::string encoding)
{
    using namespace booster::locale::conv;
    booster::locale::generator g;
    std::locale l= encoding == "ISO8859-8" ? g("he_IL."+encoding) : g("en_US."+encoding);
    TEST(to_utf<Char>(source,encoding)==target);
    TEST(to_utf<Char>(source.c_str(),encoding)==target);
    TEST(to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target);
    
    TEST(to_utf<Char>(source,l)==target);
    TEST(to_utf<Char>(source.c_str(),l)==target);
    TEST(to_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target);

    TEST(from_utf<Char>(target,encoding)==source);
    TEST(from_utf<Char>(target.c_str(),encoding)==source);
    TEST(from_utf<Char>(target.c_str(),target.c_str()+target.size(),encoding)==source);
    
    TEST(from_utf<Char>(target,l)==source);
    TEST(from_utf<Char>(target.c_str(),l)==source);
    TEST(from_utf<Char>(target.c_str(),target.c_str()+target.size(),l)==source);
}